

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall soplex::CLUFactor<double>::selectPivots(CLUFactor<double> *this,double threshold)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Pring *pPVar4;
  Pring *pPVar5;
  Pring *pPVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  pointer pdVar13;
  pointer pdVar14;
  int *piVar15;
  Pring *pPVar16;
  pointer pdVar17;
  pointer pdVar18;
  int *piVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  Pring *pPVar24;
  Pring *pPVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  Pring *pPVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  int local_cc;
  int local_c8;
  
  iVar22 = ~(this->temp).stage + this->thedim;
  iVar26 = 4;
  if (iVar22 < 4) {
    iVar26 = iVar22;
  }
  pPVar4 = (this->temp).pivot_rowNZ;
  pPVar5 = (this->temp).pivot_col;
  pPVar6 = (this->temp).pivot_colNZ;
  piVar7 = (this->u).col.start;
  piVar8 = (this->u).col.len;
  piVar9 = (this->temp).s_cact;
  iVar30 = this->thedim + 1;
  piVar10 = (this->u).col.idx;
  piVar11 = (this->u).row.len;
  piVar12 = (this->u).row.start;
  pdVar13 = (this->temp).s_max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar14 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar15 = (this->u).row.idx;
  dVar39 = 0.0;
  pPVar16 = (this->temp).pivot_row;
  iVar36 = 0;
  iVar33 = 2;
  local_c8 = -1;
  local_cc = -1;
  iVar22 = -1;
LAB_001ddc09:
  pPVar25 = pPVar4 + iVar33;
  pPVar29 = pPVar4[iVar33].next;
  if (pPVar29 == pPVar25) {
    pPVar24 = pPVar6 + iVar33;
    do {
      if (pPVar24 != pPVar24->next) {
        iVar22 = pPVar24->next->idx;
        iVar28 = piVar9[iVar22];
        if (iVar28 < 1) goto LAB_001ddeed;
        iVar34 = piVar7[iVar22] + -1 + piVar8[iVar22];
        pdVar17 = (this->temp).s_max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar18 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar19 = (this->u).row.start;
        lVar32 = (long)iVar34;
        iVar31 = -1;
        iVar27 = iVar30;
        goto LAB_001ddd9a;
      }
      pPVar29 = pPVar25[1].next;
      pPVar25 = pPVar25 + 1;
      iVar33 = iVar33 + 1;
      pPVar24 = pPVar24 + 1;
    } while (pPVar25 == pPVar29);
  }
  local_cc = pPVar29->idx;
  iVar28 = piVar12[local_cc];
  iVar34 = piVar11[local_cc];
  iVar27 = iVar34 + iVar28 + -1;
  dVar40 = pdVar13[local_cc];
  if (dVar40 < 0.0) {
    dVar40 = ABS(pdVar14[iVar27]);
    iVar31 = iVar34 + iVar28 + -2;
    if (iVar28 <= iVar31) {
      lVar32 = (long)iVar31 + 1;
      dVar41 = dVar40;
      do {
        dVar40 = ABS(pdVar14[lVar32 + -1]);
        if (ABS(pdVar14[lVar32 + -1]) <= dVar41) {
          dVar40 = dVar41;
        }
        lVar32 = lVar32 + -1;
        dVar41 = dVar40;
      } while (iVar28 < lVar32);
    }
    pdVar13[local_cc] = dVar40;
  }
  if (iVar34 < 1) {
LAB_001ddeed:
    iVar31 = -1;
    iVar23 = iVar30;
  }
  else {
    lVar32 = (long)iVar27 + 1;
    iVar31 = -1;
    iVar34 = iVar30;
    do {
      iVar2 = piVar15[lVar32 + -1];
      iVar23 = piVar9[iVar2];
      dVar39 = pdVar14[lVar32 + -1];
      if (((iVar23 < iVar34) && (dVar40 * threshold < ABS(dVar39))) &&
         (iVar31 = iVar27, iVar22 = iVar2, iVar34 = iVar23, iVar23 <= iVar33)) break;
      iVar23 = iVar34;
      iVar27 = iVar27 + -1;
      lVar32 = lVar32 + -1;
      iVar34 = iVar23;
    } while (iVar28 < lVar32);
  }
  goto LAB_001ddf12;
LAB_001ddd9a:
  do {
    iVar2 = piVar10[lVar32];
    iVar23 = piVar11[iVar2];
    if (iVar23 < iVar27) {
      dVar40 = pdVar17[iVar2];
      iVar3 = piVar19[iVar2];
      lVar38 = (long)iVar3;
      if (dVar40 <= 0.0) {
        dVar40 = ABS(pdVar18[lVar38]);
        iVar35 = iVar3 + iVar23;
        lVar37 = (long)iVar35;
        if (iVar3 < iVar35) {
          iVar35 = iVar3;
        }
        do {
          if (lVar37 <= lVar38) goto LAB_001dde5f;
          lVar1 = lVar37 + -1;
          lVar20 = lVar37 + -1;
          dVar41 = ABS(pdVar18[lVar20]);
          if (dVar41 <= dVar40) {
            dVar41 = dVar40;
          }
          dVar40 = dVar41;
          lVar21 = lVar37 + -1;
          lVar37 = lVar1;
        } while ((this->u).row.idx[lVar21] != iVar22);
        local_c8 = (int)lVar1;
        iVar35 = local_c8 + 1;
        dVar39 = pdVar18[lVar20];
LAB_001dde5f:
        if (iVar3 < iVar35 + -2) {
          lVar37 = (long)iVar35 + -2;
          dVar41 = dVar40;
          do {
            dVar40 = ABS(pdVar18[lVar37]);
            if (ABS(pdVar18[lVar37]) <= dVar41) {
              dVar40 = dVar41;
            }
            lVar37 = lVar37 + -1;
            dVar41 = dVar40;
          } while (lVar38 < lVar37);
        }
        pdVar17[iVar2] = dVar40;
      }
      else {
        lVar37 = (long)(iVar3 + iVar23);
        do {
          if (lVar37 <= lVar38) goto LAB_001ddeb1;
          lVar1 = lVar37 + -1;
          lVar20 = lVar37 + -1;
          lVar37 = lVar1;
        } while ((this->u).row.idx[lVar20] != iVar22);
        dVar39 = pdVar18[lVar1];
        local_c8 = (int)lVar1;
      }
LAB_001ddeb1:
      if ((dVar40 * threshold < ABS(dVar39)) &&
         (iVar31 = local_c8, local_cc = iVar2, iVar27 = iVar23, iVar23 <= iVar33 + 1)) break;
    }
    iVar23 = iVar27;
    lVar32 = lVar32 + -1;
    iVar27 = iVar23;
  } while (iVar34 - iVar28 < lVar32);
LAB_001ddf12:
  pPVar25 = pPVar5[iVar22].next;
  pPVar25->prev = pPVar5[iVar22].prev;
  (pPVar5[iVar22].prev)->next = pPVar25;
  pPVar5[iVar22].next = pPVar5 + iVar22;
  pPVar5[iVar22].prev = pPVar5 + iVar22;
  if (-1 < iVar31) {
    lVar32 = (long)local_cc;
    pPVar16[lVar32].pos = iVar31 - piVar12[lVar32];
    iVar28 = (iVar33 + -1) * (iVar23 + -1);
    pPVar16[lVar32].mkwtz = iVar28;
    pPVar25 = &(this->temp).pivots;
    do {
      pPVar25 = pPVar25->next;
      if ((pPVar25->idx < 0) || (pPVar25->idx == local_cc)) break;
    } while (pPVar25->mkwtz < iVar28);
    pPVar25 = pPVar25->prev;
    if (pPVar25->idx != local_cc) {
      pPVar29 = pPVar16[lVar32].next;
      pPVar29->prev = pPVar16[lVar32].prev;
      (pPVar16[lVar32].prev)->next = pPVar29;
      pPVar29 = pPVar25->next;
      pPVar16[lVar32].next = pPVar29;
      pPVar29->prev = pPVar16 + lVar32;
      pPVar16[lVar32].prev = pPVar25;
      pPVar25->next = pPVar16 + lVar32;
    }
    iVar36 = iVar36 + 1;
    if (iVar26 <= iVar36) {
      return;
    }
  }
  goto LAB_001ddc09;
}

Assistant:

void CLUFactor<R>::selectPivots(R threshold)
{
   int ii;
   int i;
   int j;
   int k;
   int ll = -1; // This value should never be used.
   int kk;
   int m;
   int count;
   int num;
   int rw = -1; // This value should never be used.
   int cl = -1; // This value should never be used.
   int len;
   int beg;
   R l_maxabs;
   R x = R(0.0);   // This value should never be used.
   int mkwtz;
   int candidates;

   candidates = thedim - temp.stage - 1;

   if(candidates > 4)
      candidates = 4;

   num = 0;

   count = 2;

   for(;;)
   {
      ii = -1;

      if(temp.pivot_rowNZ[count].next != &(temp.pivot_rowNZ[count]))
      {
         rw = temp.pivot_rowNZ[count].next->idx;
         beg = u.row.start[rw];
         len = u.row.len[rw] + beg - 1;

         /*  set l_maxabs to maximum absolute value in row
          *  (compute it if necessary).
          */

         if((l_maxabs = temp.s_max[rw]) < 0)
         {
            l_maxabs = spxAbs(u.row.val[len]);

            for(i = len - 1; i >= beg; --i)
               if(l_maxabs < spxAbs(u.row.val[i]))
                  l_maxabs = spxAbs(u.row.val[i]);

            temp.s_max[rw] = l_maxabs;               /* ##### */
         }

         l_maxabs *= threshold;

         /*  select pivot element with lowest markowitz number in row
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.row.idx[i];
            j = temp.s_cact[k];
            x = u.row.val[i];

            if(j < mkwtz && spxAbs(x) > l_maxabs)
            {
               mkwtz = j;
               cl = k;
               ii = i;

               if(j <= count)               /* ##### */
                  break;
            }
         }
      }
      else if(temp.pivot_colNZ[count].next != &(temp.pivot_colNZ[count]))
      {
         cl = temp.pivot_colNZ[count].next->idx;
         beg = u.col.start[cl];
         len = u.col.len[cl] + beg - 1;
         beg = len - temp.s_cact[cl] + 1;
         assert(count == temp.s_cact[cl]);

         /*  select pivot element with lowest markowitz number in column
          */
         mkwtz = thedim + 1;

         for(i = len; i >= beg; --i)
         {
            k = u.col.idx[i];
            j = u.row.len[k];

            if(j < mkwtz)
            {
               /*  ensure that element (cl,k) is stable.
                */
               if(temp.s_max[k] > 0)
               {
                  /*  case 1: l_maxabs is known
                   */
                  for(m = u.row.start[k], kk = m + u.row.len[k] - 1;
                        kk >= m; --kk)
                  {
                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  l_maxabs = temp.s_max[k];
               }
               else
               {
                  /*  case 2: l_maxabs needs to be computed
                   */
                  m = u.row.start[k];
                  l_maxabs = spxAbs(u.row.val[m]);

                  for(kk = m + u.row.len[k] - 1; kk >= m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);

                     if(u.row.idx[kk] == cl)
                     {
                        x = u.row.val[kk];
                        ll = kk;
                        break;
                     }
                  }

                  for(--kk; kk > m; --kk)
                  {
                     if(l_maxabs < spxAbs(u.row.val[kk]))
                        l_maxabs = spxAbs(u.row.val[kk]);
                  }

                  temp.s_max[k] = l_maxabs;
               }

               l_maxabs *= threshold;

               if(spxAbs(x) > l_maxabs)
               {
                  mkwtz = j;
                  rw = k;
                  ii = ll;

                  if(j <= count + 1)
                     break;
               }
            }
         }
      }
      else
      {
         ++count;
         continue;
      }

      assert(cl >= 0);

      removeDR(temp.pivot_col[cl]);
      initDR(temp.pivot_col[cl]);

      if(ii >= 0)
      {
         /*  Initialize selected pivot element
          */
         CLUFactor<R>::Pring* pr;
         temp.pivot_row[rw].pos = ii - u.row.start[rw];
         temp.pivot_row[rw].mkwtz = mkwtz = (mkwtz - 1) * (count - 1);
         // ??? mkwtz originally was long,
         // maybe to avoid an overflow in this instruction?

         for(pr = temp.pivots.next; pr->idx >= 0; pr = pr->next)
         {
            if(pr->idx == rw || pr->mkwtz >= mkwtz)
               break;
         }

         pr = pr->prev;

         if(pr->idx != rw)
         {
            removeDR(temp.pivot_row[rw]);
            init2DR(temp.pivot_row[rw], *pr);
         }

         num++;

         if(num >= candidates)
            break;
      }
   }

   /*
    *     while(temp.temp.next->mkwtz < temp.temp.prev->mkwtz)
    *     {
    *     Pring   *pr;
    *     pr = temp.temp.prev;
    *     removeDR(*pr);
    *     init2DR (*pr, rowNZ[u.row.len[pr->idx]]);
    }
    */

   assert(row.perm[rw] < 0);

   assert(col.perm[cl] < 0);
}